

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktPipelineImageViewTests.cpp
# Opt level: O0

vector<vk::VkComponentMapping,_std::allocator<vk::VkComponentMapping>_> *
vkt::pipeline::anon_unknown_2::getComponentMappingPermutations
          (vector<vk::VkComponentMapping,_std::allocator<vk::VkComponentMapping>_>
           *__return_storage_ptr__,VkComponentMapping *componentMapping)

{
  undefined1 local_6c [8];
  VkComponentMapping mappingPermutation;
  int channelNdx;
  VkComponentSwizzle currentChannel [4];
  int local_3c;
  VkComponentSwizzle local_38;
  int firstChannelNdx;
  VkComponentSwizzle channelSwizzles [4];
  VkComponentMapping *componentMapping_local;
  vector<vk::VkComponentMapping,_std::allocator<vk::VkComponentMapping>_> *mappings;
  
  std::vector<vk::VkComponentMapping,_std::allocator<vk::VkComponentMapping>_>::vector
            (__return_storage_ptr__);
  local_38 = componentMapping->r;
  firstChannelNdx = componentMapping->g;
  channelSwizzles[0] = componentMapping->b;
  channelSwizzles[1] = componentMapping->a;
  for (local_3c = 0; local_3c < 4; local_3c = local_3c + 1) {
    for (mappingPermutation.b = VK_COMPONENT_SWIZZLE_IDENTITY; (int)mappingPermutation.b < 4;
        mappingPermutation.b = mappingPermutation.b + VK_COMPONENT_SWIZZLE_ZERO) {
      (&mappingPermutation.a)[(int)mappingPermutation.b] =
           (&local_38)[(int)(local_3c + mappingPermutation.b) % 4];
    }
    local_6c._0_4_ = mappingPermutation.a;
    std::vector<vk::VkComponentMapping,_std::allocator<vk::VkComponentMapping>_>::push_back
              (__return_storage_ptr__,(value_type *)local_6c);
  }
  return __return_storage_ptr__;
}

Assistant:

static std::vector<VkComponentMapping> getComponentMappingPermutations (const VkComponentMapping& componentMapping)
{
	std::vector<VkComponentMapping> mappings;

	const VkComponentSwizzle channelSwizzles[4] = { componentMapping.r, componentMapping.g, componentMapping.b, componentMapping.a };

	// Rearranges the channels by shifting their positions.
	for (int firstChannelNdx = 0; firstChannelNdx < 4; firstChannelNdx++)
	{
		VkComponentSwizzle currentChannel[4];

		for (int channelNdx = 0; channelNdx < 4; channelNdx++)
			currentChannel[channelNdx] = channelSwizzles[(firstChannelNdx + channelNdx) % 4];

		const VkComponentMapping mappingPermutation  =
		{
			currentChannel[0],
			currentChannel[1],
			currentChannel[2],
			currentChannel[3]
		};

		mappings.push_back(mappingPermutation);
	}

	return mappings;
}